

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRGBA.hpp
# Opt level: O2

bool deqp::gls::isEdgeTriplet(RGBA *c1,RGBA *c2,RGBA *c3,IVec3 *renderTargetThreshold)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  uVar1 = c1->m_value;
  uVar2 = c2->m_value;
  uVar3 = c3->m_value;
  if ((uVar1 & 0xffffff) == 0) {
    if (((uVar2 | uVar3) & 0xffffff) != 0) {
      return true;
    }
  }
  else if ((uVar2 & 0xffffff) == 0 || (uVar3 & 0xffffff) == 0) {
    return true;
  }
  if (((uVar2 | uVar1 | uVar3) & 0xffffff) != 0) {
    iVar4 = (uVar3 & 0xff) + (uVar1 & 0xff) + (uVar2 & 0xff) * -2;
    iVar5 = -iVar4;
    if (0 < iVar4) {
      iVar5 = iVar4;
    }
    if (iVar5 <= renderTargetThreshold->m_data[0] * 2) {
      iVar4 = ((uVar1 >> 8 & 0xff) - (uVar2 >> 7 & 0x1fe)) + (uVar3 >> 8 & 0xff);
      iVar5 = -iVar4;
      if (0 < iVar4) {
        iVar5 = iVar4;
      }
      if (iVar5 <= renderTargetThreshold->m_data[1] * 2) {
        iVar4 = ((uVar1 >> 0x10 & 0xff) - (uVar2 >> 0xf & 0x1fe)) + (uVar3 >> 0x10 & 0xff);
        iVar5 = -iVar4;
        if (0 < iVar4) {
          iVar5 = iVar4;
        }
        return renderTargetThreshold->m_data[2] * 2 < iVar5;
      }
    }
    return true;
  }
  return false;
}

Assistant:

int			getRed					(void) const { return (int)((m_value >> (deUint32)RED_SHIFT)   & 0xFFu); }